

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.cpp
# Opt level: O1

UnicodeString *
icu_63::SimpleFormatter::format
          (UChar *compiledPattern,int32_t compiledPatternLength,UnicodeString **values,
          UnicodeString *result,UnicodeString *resultCopy,UBool forbidResultAsValue,int32_t *offsets
          ,int32_t offsetsLength,UErrorCode *errorCode)

{
  UChar UVar1;
  short sVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int32_t srcLength;
  int iVar6;
  UnicodeString *src;
  uint uVar7;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (0 < offsetsLength) {
      memset(offsets,0xff,(ulong)(uint)offsetsLength << 2);
    }
    iVar6 = 1;
    do {
      if (compiledPatternLength <= iVar6) {
        return result;
      }
      lVar4 = (long)iVar6;
      iVar6 = iVar6 + 1;
      UVar1 = compiledPattern[lVar4];
      if ((ushort)UVar1 < 0x100) {
        uVar7 = (uint)(ushort)UVar1;
        src = values[(ushort)UVar1];
        if (src == (UnicodeString *)0x0) {
LAB_002b3d73:
          *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
          bVar3 = false;
        }
        else {
          if (src == result) {
            if (forbidResultAsValue != '\0') goto LAB_002b3d73;
            if (iVar6 == 2) {
              bVar3 = true;
              if ((int)uVar7 < offsetsLength) {
                offsets[(ushort)UVar1] = 0;
              }
              goto LAB_002b3db1;
            }
            src = resultCopy;
            if ((int)uVar7 < offsetsLength) {
              sVar2 = (result->fUnion).fStackFields.fLengthAndFlags;
              if (sVar2 < 0) {
                iVar5 = (result->fUnion).fFields.fLength;
              }
              else {
                iVar5 = (int)sVar2 >> 5;
              }
              offsets[(ushort)UVar1] = iVar5;
            }
          }
          else if ((int)uVar7 < offsetsLength) {
            sVar2 = (result->fUnion).fStackFields.fLengthAndFlags;
            if (sVar2 < 0) {
              iVar5 = (result->fUnion).fFields.fLength;
            }
            else {
              iVar5 = (int)sVar2 >> 5;
            }
            offsets[(ushort)UVar1] = iVar5;
          }
          sVar2 = (src->fUnion).fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            srcLength = (src->fUnion).fFields.fLength;
          }
          else {
            srcLength = (int)sVar2 >> 5;
          }
          UnicodeString::doAppend(result,src,0,srcLength);
          bVar3 = true;
        }
      }
      else {
        iVar5 = (ushort)UVar1 - 0x100;
        UnicodeString::doAppend(result,compiledPattern + iVar6,0,iVar5);
        iVar6 = iVar6 + iVar5;
        bVar3 = true;
      }
LAB_002b3db1:
    } while (bVar3);
  }
  return result;
}

Assistant:

UnicodeString &SimpleFormatter::format(
        const UChar *compiledPattern, int32_t compiledPatternLength,
        const UnicodeString *const *values,
        UnicodeString &result, const UnicodeString *resultCopy, UBool forbidResultAsValue,
        int32_t *offsets, int32_t offsetsLength,
        UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return result;
    }
    for (int32_t i = 0; i < offsetsLength; i++) {
        offsets[i] = -1;
    }
    for (int32_t i = 1; i < compiledPatternLength;) {
        int32_t n = compiledPattern[i++];
        if (n < ARG_NUM_LIMIT) {
            const UnicodeString *value = values[n];
            if (value == NULL) {
                errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                return result;
            }
            if (value == &result) {
                if (forbidResultAsValue) {
                    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                    return result;
                }
                if (i == 2) {
                    // We are appending to result which is also the first value object.
                    if (n < offsetsLength) {
                        offsets[n] = 0;
                    }
                } else {
                    if (n < offsetsLength) {
                        offsets[n] = result.length();
                    }
                    result.append(*resultCopy);
                }
            } else {
                if (n < offsetsLength) {
                    offsets[n] = result.length();
                }
                result.append(*value);
            }
        } else {
            int32_t length = n - ARG_NUM_LIMIT;
            result.append(compiledPattern + i, length);
            i += length;
        }
    }
    return result;
}